

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.cpp
# Opt level: O2

void __thiscall chrono::ChLink::ArchiveOUT(ChLink *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLink>(marchive);
  ChLinkBase::ArchiveOUT(&this->super_ChLinkBase,marchive);
  local_30._value = &this->react_force;
  local_30._name = "react_force";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->react_torque;
  local_48._name = "react_torque";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLink::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLink>();

    // serialize parent class
    ChLinkBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(react_force);
    marchive << CHNVP(react_torque);
}